

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::emitUrlSelected(QFileDialogPrivate *this,QUrl *file)

{
  QObject *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayData *local_58;
  QUrl *local_50;
  void *local_38;
  undefined1 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_58 = (QArrayData *)0x0;
  local_50 = file;
  QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,4,&local_58);
  cVar2 = QUrl::isLocalFile();
  if (cVar2 != '\0') {
    QUrl::toLocalFile();
    local_38 = (void *)0x0;
    local_30 = (undefined1 *)&local_58;
    QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,0,&local_38);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::emitUrlSelected(const QUrl &file)
{
    Q_Q(QFileDialog);
    emit q->urlSelected(file);
    if (file.isLocalFile())
        emit q->fileSelected(file.toLocalFile());
}